

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

KFLOAT32 * __thiscall KDIS::DATA_TYPE::Vector::operator[](Vector *this,KUINT16 i)

{
  KException *this_00;
  KString local_40;
  
  if (i < 3) {
    return &this->m_f32X + (i & 0x3fff);
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"operator[]","");
  KException::KException(this_00,&local_40,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

const KFLOAT32 &Vector::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
        case 0:		return m_f32X;
        case 1:		return m_f32Y;
        case 2:		return m_f32Z;
        default:    throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}